

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::anon_unknown_0::BufferIoExecutor::readOutputBuffer
          (BufferIoExecutor *this,void **outputPtrs,int numValues)

{
  deUint32 dVar1;
  VkDevice device;
  DeviceInterface *vkd;
  Allocation *pAVar2;
  VkDeviceMemory memory;
  VkDeviceSize offset;
  VarType *pVVar3;
  const_reference pvVar4;
  reference layout_00;
  void *srcBasePtr;
  VarLayout *layout;
  VarType *varType;
  size_t outputNdx;
  int outputBufferSize;
  deUint32 outputStride;
  DeviceInterface *vk;
  VkDevice vkDevice;
  int numValues_local;
  void **outputPtrs_local;
  BufferIoExecutor *this_local;
  
  device = Context::getDevice((this->super_ShaderExecutor).m_context);
  vkd = Context::getDeviceInterface((this->super_ShaderExecutor).m_context);
  dVar1 = getLayoutStride(&this->m_outputLayout);
  pAVar2 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_outputAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  memory = ::vk::Allocation::getMemory(pAVar2);
  pAVar2 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_outputAlloc).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  offset = ::vk::Allocation::getOffset(pAVar2);
  ::vk::invalidateMappedMemoryRange(vkd,device,memory,offset,(long)(int)(numValues * dVar1));
  varType = (VarType *)0x0;
  while( true ) {
    pVVar3 = (VarType *)
             std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             ::size(&(this->super_ShaderExecutor).m_shaderSpec.outputs);
    if (pVVar3 <= varType) break;
    pvVar4 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             ::operator[](&(this->super_ShaderExecutor).m_shaderSpec.outputs,(size_type)varType);
    layout_00 = std::
                vector<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
                ::operator[](&this->m_outputLayout,(size_type)varType);
    pAVar2 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
             operator->(&(this->m_outputAlloc).
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    srcBasePtr = ::vk::Allocation::getHostPtr(pAVar2);
    copyFromBuffer(&pvVar4->varType,layout_00,numValues,srcBasePtr,outputPtrs[(long)varType]);
    varType = (VarType *)((long)&varType->m_type + 1);
  }
  return;
}

Assistant:

void BufferIoExecutor::readOutputBuffer (void* const* outputPtrs, int numValues)
{
	const VkDevice			vkDevice			= m_context.getDevice();
	const DeviceInterface&	vk					= m_context.getDeviceInterface();

	const deUint32			outputStride		= getLayoutStride(m_outputLayout);
	const int				outputBufferSize	= numValues * outputStride;

	DE_ASSERT(outputBufferSize > 0); // At least some outputs are required.

	invalidateMappedMemoryRange(vk, vkDevice, m_outputAlloc->getMemory(), m_outputAlloc->getOffset(), outputBufferSize);

	DE_ASSERT(m_shaderSpec.outputs.size() == m_outputLayout.size());
	for (size_t outputNdx = 0; outputNdx < m_shaderSpec.outputs.size(); ++outputNdx)
	{
		const glu::VarType&		varType		= m_shaderSpec.outputs[outputNdx].varType;
		const VarLayout&		layout		= m_outputLayout[outputNdx];

		copyFromBuffer(varType, layout, numValues, m_outputAlloc->getHostPtr(), outputPtrs[outputNdx]);
	}
}